

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Crop *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Mat *pMVar4;
  Mat *this_01;
  int *piVar5;
  void *pvVar6;
  ulong uVar7;
  size_t sVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined8 uVar21;
  undefined4 uVar28;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  undefined8 uVar36;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  bool bVar47;
  int iVar48;
  pointer pMVar49;
  ulong uVar50;
  long lVar51;
  uint uVar52;
  Allocator *pAVar53;
  int iVar54;
  int iVar55;
  Allocator *pAVar56;
  long lVar57;
  bool bVar58;
  bool bVar59;
  Mat m;
  Mat m_1;
  int _outw;
  int _woffset;
  int _outh;
  int _outc;
  int _outd;
  int _hoffset;
  int local_d0;
  int local_cc;
  Option *local_c8;
  int local_c0;
  int _coffset;
  size_t local_b8;
  int local_b0;
  int _doffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined3 uVar24;
  undefined1 uVar25;
  undefined2 uVar26;
  undefined1 uVar27;
  undefined4 uVar30;
  undefined3 uVar32;
  undefined2 uVar34;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined3 uVar39;
  undefined1 uVar40;
  undefined2 uVar41;
  undefined1 uVar42;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = pMVar4->elempack;
  iVar2 = pMVar4[1].elempack;
  local_c8 = opt;
  if (iVar1 != 4) goto LAB_0026f238;
  local_d0 = pMVar4->w;
  local_c0 = pMVar4->h;
  iVar3 = pMVar4->d;
  local_b0 = pMVar4->c;
  local_cc = pMVar4->dims;
  local_b8 = pMVar4->elemsize;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]);
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86[-3]) != -0xe9) {
    switch(pMVar4->dims) {
    case 1:
      m.cstep = (long)pMVar4->elempack * (long)pMVar4->w;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 1;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      break;
    case 2:
      m.w = pMVar4->w;
      lVar51 = (long)pMVar4->elempack * (long)pMVar4->h;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 2;
      m.h = (int)lVar51;
      m.d = 1;
      m.c = 1;
      m.cstep = lVar51 * m.w;
      break;
    case 3:
      m.w = pMVar4->w;
      m.h = pMVar4->h;
      m.c = pMVar4->elempack * pMVar4->c;
      m.dims = 3;
      m.d = 1;
      lVar51 = (long)m.h * (long)m.w;
      goto LAB_0026dd90;
    case 4:
      m.w = pMVar4->w;
      m.h = pMVar4->h;
      m.d = pMVar4->d;
      m.c = pMVar4->elempack * pMVar4->c;
      m.dims = 4;
      lVar51 = (long)m.h * (long)m.w * (long)m.d;
LAB_0026dd90:
      m.elempack = 1;
      m.elemsize._0_4_ = 4;
      m.cstep = lVar51 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    switch(pMVar4[1].dims) {
    case 1:
      m_1.cstep = (long)pMVar4[1].elempack * (long)pMVar4[1].w;
      m_1.elemsize._0_4_ = 4;
      m_1.elempack = 1;
      m_1.dims = 1;
      m_1.w = (int)m_1.cstep;
      m_1.h = 1;
      m_1.d = 1;
      m_1.c = 1;
      break;
    case 2:
      m_1.w = pMVar4[1].w;
      lVar51 = (long)pMVar4[1].elempack * (long)pMVar4[1].h;
      m_1.elemsize._0_4_ = 4;
      m_1.elempack = 1;
      m_1.dims = 2;
      m_1.h = (int)lVar51;
      m_1.d = 1;
      m_1.c = 1;
      m_1.cstep = lVar51 * m_1.w;
      break;
    case 3:
      m_1.w = pMVar4[1].w;
      m_1.h = pMVar4[1].h;
      m_1.c = pMVar4[1].elempack * pMVar4[1].c;
      m_1.dims = 3;
      m_1.d = 1;
      lVar51 = (long)m_1.h * (long)m_1.w;
      goto LAB_0026e0ae;
    case 4:
      m_1.w = pMVar4[1].w;
      m_1.h = pMVar4[1].h;
      m_1.d = pMVar4[1].d;
      m_1.c = pMVar4[1].elempack * pMVar4[1].c;
      m_1.dims = 4;
      lVar51 = (long)m_1.h * (long)m_1.w * (long)m_1.d;
LAB_0026e0ae:
      m_1.elempack = 1;
      m_1.elemsize._0_4_ = 4;
      m_1.cstep = lVar51 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      m_1.cstep = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
    }
    m_1.elemsize._4_4_ = 0;
    m_1.refcount._4_4_ = 0;
    m_1.refcount._0_4_ = 0;
    m_1.allocator = (Allocator *)0x0;
    m_1.data = (void *)0x0;
    pAVar53 = (Allocator *)&_hoffset;
    Crop::resolve_crop_roi
              (this_00,&m,&m_1,&_woffset,(int *)pAVar53,&_doffset,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          if (m_1.data != (void *)0x0) {
            free(m_1.data);
          }
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 != 0) goto LAB_0026e231;
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        goto LAB_0026e231;
      }
      if (m.data == (void *)0x0) goto LAB_0026e231;
      goto LAB_0026e229;
    }
    goto LAB_0026e231;
  }
  switch(pMVar4->dims) {
  case 1:
    m.cstep = (long)pMVar4->elempack * (long)pMVar4->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = pMVar4->w;
    lVar51 = (long)pMVar4->elempack * (long)pMVar4->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar51;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar51 * m.w;
    break;
  case 3:
    m.w = pMVar4->w;
    m.h = pMVar4->h;
    m.c = pMVar4->elempack * pMVar4->c;
    m.dims = 3;
    m.d = 1;
    lVar51 = (long)m.h * (long)m.w;
    goto LAB_0026dd19;
  case 4:
    m.w = pMVar4->w;
    m.h = pMVar4->h;
    m.d = pMVar4->d;
    m.c = pMVar4->elempack * pMVar4->c;
    m.dims = 4;
    lVar51 = (long)m.h * (long)m.w * (long)m.d;
LAB_0026dd19:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar51 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  pAVar53 = (Allocator *)&_hoffset;
  Crop::resolve_crop_roi
            (this_00,&m,(int *)pMVar4[1].data,&_woffset,(int *)pAVar53,&_doffset,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_0026e229:
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0026e231:
  iVar55 = iVar3;
  if (local_cc == 1) {
    uVar52 = _outw & 3;
    iVar54 = (uint)(uVar52 == 0) * 3 + 1;
    if (_outw / iVar54 == local_d0 && uVar52 == 0) {
      if (this_01 != pMVar4) {
        piVar5 = pMVar4->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = this_01->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar6 = this_01->data;
            pAVar56 = this_01->allocator;
            if (pAVar56 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar56->_vptr_Allocator[3])(pAVar56,pvVar6,(long)_outw % (long)iVar54 & 0xffffffff)
              ;
            }
          }
        }
        this_01->cstep = 0;
        this_01->data = (void *)0x0;
        this_01->refcount = (int *)0x0;
        *(undefined8 *)((long)&this_01->refcount + 4) = 0;
        *(undefined8 *)((long)&this_01->elemsize + 4) = 0;
        this_01->dims = 0;
        this_01->w = 0;
        this_01->h = 0;
        this_01->d = 0;
        this_01->c = 0;
        piVar5 = pMVar4->refcount;
        this_01->data = pMVar4->data;
        this_01->refcount = piVar5;
        this_01->elemsize = pMVar4->elemsize;
        this_01->elempack = pMVar4->elempack;
        this_01->allocator = pMVar4->allocator;
        iVar55 = pMVar4->w;
        iVar54 = pMVar4->h;
        iVar48 = pMVar4->d;
        this_01->dims = pMVar4->dims;
        this_01->w = iVar55;
        this_01->h = iVar54;
        this_01->d = iVar48;
        this_01->c = pMVar4->c;
        this_01->cstep = pMVar4->cstep;
      }
LAB_0026e3ac:
      bVar58 = false;
      iVar55 = 0;
    }
    else if (((_outw | _woffset) & 3U) == 0) {
      pAVar53 = local_c8->blob_allocator;
      Mat::create(this_01,_outw / iVar54,(local_b8 >> 2) << (uVar52 == 0) * '\x02',iVar54,pAVar53);
      iVar55 = -100;
      if (this_01->data == (void *)0x0) {
        bVar58 = false;
      }
      else {
        bVar58 = false;
        if ((long)this_01->c * this_01->cstep != 0) {
          iVar55 = _woffset + 3;
          if (-1 < _woffset) {
            iVar55 = _woffset;
          }
          crop_pack4_sse(pMVar4,this_01,0,iVar55 >> 2);
          goto LAB_0026e3ac;
        }
      }
    }
    else {
      bVar58 = true;
    }
    if (bVar58) goto LAB_0026e3be;
LAB_0026f219:
    bVar58 = false;
  }
  else {
LAB_0026e3be:
    if (local_cc == 2) {
      bVar58 = (_outh & 3U) == 0;
      iVar54 = (uint)bVar58 * 3 + 1;
      pAVar53 = (Allocator *)0x0;
      if (_outw == local_d0) {
        if (((_outh & 3U) != 0) || (_outh / iVar54 != local_c0)) goto LAB_0026e464;
        if (this_01 != pMVar4) {
          piVar5 = pMVar4->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = this_01->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = this_01->data;
              pAVar56 = this_01->allocator;
              if (pAVar56 == (Allocator *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (*pAVar56->_vptr_Allocator[3])
                          (pAVar56,pvVar6,(long)_outh % (long)iVar54 & 0xffffffff);
              }
            }
          }
          this_01->cstep = 0;
          this_01->data = (void *)0x0;
          this_01->refcount = (int *)0x0;
          *(undefined8 *)((long)&this_01->refcount + 4) = 0;
          *(undefined8 *)((long)&this_01->elemsize + 4) = 0;
          this_01->dims = 0;
          this_01->w = 0;
          this_01->h = 0;
          this_01->d = 0;
          this_01->c = 0;
          piVar5 = pMVar4->refcount;
          this_01->data = pMVar4->data;
          this_01->refcount = piVar5;
          this_01->elemsize = pMVar4->elemsize;
          this_01->elempack = pMVar4->elempack;
          this_01->allocator = pMVar4->allocator;
          iVar55 = pMVar4->w;
          iVar54 = pMVar4->h;
          iVar48 = pMVar4->d;
          this_01->dims = pMVar4->dims;
          this_01->w = iVar55;
          this_01->h = iVar54;
          this_01->d = iVar48;
          this_01->c = pMVar4->c;
          this_01->cstep = pMVar4->cstep;
        }
LAB_0026e54a:
        bVar59 = false;
        iVar55 = 0;
      }
      else {
LAB_0026e464:
        bVar59 = true;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(this_01,_outw,_outh / iVar54,(local_b8 >> 2) << bVar58 * '\x02',iVar54,
                      local_c8->blob_allocator);
          iVar55 = -100;
          if (this_01->data == (void *)0x0) {
            bVar59 = false;
          }
          else {
            bVar59 = false;
            if ((long)this_01->c * this_01->cstep != 0) {
              iVar55 = _hoffset + 3;
              if (-1 < _hoffset) {
                iVar55 = _hoffset;
              }
              crop_pack4_sse(pMVar4,this_01,iVar55 >> 2,_woffset);
              goto LAB_0026e54a;
            }
          }
        }
      }
      if (!bVar59) goto LAB_0026f219;
    }
    if (local_cc == 3) {
      bVar58 = (_outc & 3U) == 0;
      iVar54 = (uint)bVar58 * 3 + 1;
      pAVar56 = (Allocator *)((local_b8 >> 2) << bVar58 * '\x02');
      bVar58 = _outh != local_c0 || _outw != local_d0;
      if (bVar58) {
LAB_0026e613:
        bVar59 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar54;
          m.w = pMVar4->w;
          pAVar53 = (Allocator *)(long)m.w;
          m.h = pMVar4->h;
          uVar7 = pMVar4->elemsize;
          m.data = (void *)((long)(_coffset / iVar54) * pMVar4->cstep * uVar7 + (long)pMVar4->data);
          m.d = pMVar4->d;
          m.elempack = pMVar4->elempack;
          m.allocator = pMVar4->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar7;
          m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          uVar50 = (long)m.d * uVar7 * (long)m.h * (long)pAVar53 + 0xf & 0xfffffffffffffff0;
          m.cstep = uVar50 / uVar7;
          m.dims = pMVar4->dims;
          if (bVar58) {
LAB_0026e85f:
            Mat::create(this_01,_outw,_outh,_outc / iVar54,(size_t)pAVar56,iVar54,
                        local_c8->blob_allocator);
            iVar55 = -100;
            pAVar53 = pAVar56;
            if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
              if (this_01->c < 1) {
                iVar55 = 0;
              }
              else {
                lVar51 = 0;
                do {
                  uVar7 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  m_1.data = (void *)(m.cstep * lVar51 * uVar7 + (long)m.data);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.w = m.w;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = m.d;
                  m_1.dims = m.dims + -1;
                  m_1.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
                  if (m.dims == 4) {
                    m_1.cstep = (long)m.h * (long)m.w;
                  }
                  sVar8 = this_01->elemsize;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(this_01->cstep * lVar51 * sVar8 + (long)this_01->data);
                  pAVar53 = (Allocator *)(ulong)(uint)this_01->elempack;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar8;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       (undefined4)(sVar8 >> 0x20);
                  crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  lVar51 = lVar51 + 1;
                } while (lVar51 < this_01->c);
                iVar55 = 0;
              }
            }
          }
          else {
            Mat::clone(&m_1,(__fn *)&m,(void *)0x0,(int)uVar50,pAVar53);
            if (this_01 != &m_1) {
              piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + 1;
                UNLOCK();
              }
              piVar5 = this_01->refcount;
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (this_01->allocator == (Allocator *)0x0) {
                    if (this_01->data != (void *)0x0) {
                      free(this_01->data);
                    }
                  }
                  else {
                    (*this_01->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              this_01->cstep = 0;
              this_01->data = (void *)0x0;
              this_01->refcount = (int *)0x0;
              *(undefined8 *)((long)&this_01->refcount + 4) = 0;
              *(undefined8 *)((long)&this_01->elemsize + 4) = 0;
              this_01->dims = 0;
              this_01->w = 0;
              this_01->h = 0;
              this_01->d = 0;
              this_01->c = 0;
              this_01->data = m_1.data;
              this_01->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              this_01->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
              this_01->elempack = m_1.elempack;
              this_01->allocator = m_1.allocator;
              this_01->dims = m_1.dims;
              this_01->w = m_1.w;
              this_01->h = m_1.h;
              this_01->d = m_1.d;
              this_01->c = m_1.c;
              this_01->cstep = m_1.cstep;
            }
            piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar55 = -100;
            if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
            goto LAB_0026e85f;
          }
          piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar59 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar54 != local_b0)) goto LAB_0026e613;
        if (this_01 != pMVar4) {
          piVar5 = pMVar4->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = this_01->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar6 = this_01->data;
              pAVar56 = this_01->allocator;
              if (pAVar56 == (Allocator *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (*pAVar56->_vptr_Allocator[3])
                          (pAVar56,pvVar6,(long)_outc % (long)iVar54 & 0xffffffff);
              }
            }
          }
          this_01->cstep = 0;
          this_01->data = (void *)0x0;
          this_01->refcount = (int *)0x0;
          *(undefined8 *)((long)&this_01->refcount + 4) = 0;
          *(undefined8 *)((long)&this_01->elemsize + 4) = 0;
          this_01->dims = 0;
          this_01->w = 0;
          this_01->h = 0;
          this_01->d = 0;
          this_01->c = 0;
          piVar5 = pMVar4->refcount;
          this_01->data = pMVar4->data;
          this_01->refcount = piVar5;
          this_01->elemsize = pMVar4->elemsize;
          this_01->elempack = pMVar4->elempack;
          this_01->allocator = pMVar4->allocator;
          iVar55 = pMVar4->w;
          iVar54 = pMVar4->h;
          iVar48 = pMVar4->d;
          this_01->dims = pMVar4->dims;
          this_01->w = iVar55;
          this_01->h = iVar54;
          this_01->d = iVar48;
          this_01->c = pMVar4->c;
          this_01->cstep = pMVar4->cstep;
        }
        bVar59 = false;
        iVar55 = 0;
      }
      if (!bVar59) goto LAB_0026f219;
    }
    bVar58 = true;
    if (local_cc == 4) {
      bVar59 = (_outc & 3U) == 0;
      iVar54 = (uint)bVar59 * 3 + 1;
      local_b8 = (local_b8 >> 2) << bVar59 * '\x02';
      bVar59 = iVar3 == _outd;
      bVar47 = local_c0 == _outh && local_d0 == _outw;
      if (bVar59 && bVar47) {
        if (((_outc & 3U) == 0) && (_outc / iVar54 == local_b0)) {
          if (this_01 != pMVar4) {
            piVar5 = pMVar4->refcount;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + 1;
              UNLOCK();
            }
            piVar5 = this_01->refcount;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                pvVar6 = this_01->data;
                pAVar53 = this_01->allocator;
                if (pAVar53 == (Allocator *)0x0) {
                  if (pvVar6 != (void *)0x0) {
                    free(pvVar6);
                  }
                }
                else {
                  (*pAVar53->_vptr_Allocator[3])
                            (pAVar53,pvVar6,(long)_outc % (long)iVar54 & 0xffffffff);
                }
              }
            }
            this_01->cstep = 0;
            this_01->data = (void *)0x0;
            this_01->refcount = (int *)0x0;
            *(undefined8 *)((long)&this_01->refcount + 4) = 0;
            *(undefined8 *)((long)&this_01->elemsize + 4) = 0;
            this_01->dims = 0;
            this_01->w = 0;
            this_01->h = 0;
            this_01->d = 0;
            this_01->c = 0;
            piVar5 = pMVar4->refcount;
            this_01->data = pMVar4->data;
            this_01->refcount = piVar5;
            this_01->elemsize = pMVar4->elemsize;
            this_01->elempack = pMVar4->elempack;
            this_01->allocator = pMVar4->allocator;
            iVar3 = pMVar4->w;
            iVar55 = pMVar4->h;
            iVar54 = pMVar4->d;
            this_01->dims = pMVar4->dims;
            this_01->w = iVar3;
            this_01->h = iVar55;
            this_01->d = iVar54;
            this_01->c = pMVar4->c;
            this_01->cstep = pMVar4->cstep;
          }
          bVar58 = false;
          iVar55 = 0;
          goto LAB_0026f21b;
        }
      }
      if (((_coffset | _outc) & 3U) == 0) {
        m.c = _outc / iVar54;
        m.w = pMVar4->w;
        m.h = pMVar4->h;
        uVar7 = pMVar4->elemsize;
        m.data = (void *)((long)(_coffset / iVar54) * pMVar4->cstep * uVar7 + (long)pMVar4->data);
        m.d = pMVar4->d;
        m.elempack = pMVar4->elempack;
        m.allocator = pMVar4->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar7;
        m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
        uVar50 = (long)m.d * uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0;
        m.cstep = uVar50 / uVar7;
        m.dims = pMVar4->dims;
        if (bVar59 && (local_c0 == _outh && local_d0 == _outw)) {
          Mat::clone(&m_1,(__fn *)&m,(void *)0x0,(int)uVar50,
                     (void *)CONCAT71((int7)((ulong)pAVar53 >> 8),bVar59 && bVar47));
          if (this_01 != &m_1) {
            piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + 1;
              UNLOCK();
            }
            piVar5 = this_01->refcount;
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (this_01->allocator == (Allocator *)0x0) {
                  if (this_01->data != (void *)0x0) {
                    free(this_01->data);
                  }
                }
                else {
                  (*this_01->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_01->cstep = 0;
            this_01->data = (void *)0x0;
            this_01->refcount = (int *)0x0;
            *(undefined8 *)((long)&this_01->refcount + 4) = 0;
            *(undefined8 *)((long)&this_01->elemsize + 4) = 0;
            this_01->dims = 0;
            this_01->w = 0;
            this_01->h = 0;
            this_01->d = 0;
            this_01->c = 0;
            this_01->data = m_1.data;
            this_01->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            this_01->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
            this_01->elempack = m_1.elempack;
            this_01->allocator = m_1.allocator;
            this_01->dims = m_1.dims;
            this_01->w = m_1.w;
            this_01->h = m_1.h;
            this_01->d = m_1.d;
            this_01->c = m_1.c;
            this_01->cstep = m_1.cstep;
          }
          piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar55 = -100;
          if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
          goto LAB_0026eec9;
        }
        else {
LAB_0026eec9:
          Mat::create(this_01,_outw,_outh,_outd,_outc / iVar54,local_b8,iVar54,
                      local_c8->blob_allocator);
          iVar55 = -100;
          if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
            if (this_01->c < 1) {
              iVar55 = 0;
            }
            else {
              lVar51 = 0;
              do {
                if (0 < _outd) {
                  lVar57 = 0;
                  do {
                    m_1.cstep = (long)m.h * (long)m.w;
                    m_1.data = (void *)((long)m.data +
                                       (long)(_doffset + (int)lVar57) *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) * m_1.cstep
                                       + m.cstep * lVar51 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize));
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                    m_1.elemsize._4_4_ = m.elemsize._4_4_;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.dims = 2;
                    m_1.w = m.w;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = 1;
                    sVar8 = this_01->elemsize;
                    pAVar53 = this_01->allocator;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)this_01->data +
                                  lVar57 * sVar8 * (long)this_01->h * (long)this_01->w +
                                  this_01->cstep * lVar51 * sVar8);
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar8;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                         (undefined4)(sVar8 >> 0x20);
                    crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                    piVar5 = (int *)CONCAT44(bottom_blobs_unpacked.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                             bottom_blobs_unpacked.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                    if (piVar5 != (int *)0x0) {
                      LOCK();
                      *piVar5 = *piVar5 + -1;
                      UNLOCK();
                      if (*piVar5 == 0) {
                        if (pAVar53 == (Allocator *)0x0) {
                          if (bottom_blobs_unpacked.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                          }
                        }
                        else {
                          (*pAVar53->_vptr_Allocator[3])();
                        }
                      }
                    }
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                    piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar5 != (int *)0x0) {
                      LOCK();
                      *piVar5 = *piVar5 + -1;
                      UNLOCK();
                      if (*piVar5 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    lVar57 = lVar57 + 1;
                  } while (lVar57 < _outd);
                }
                lVar51 = lVar51 + 1;
              } while (lVar51 < this_01->c);
              iVar55 = 0;
            }
          }
        }
        piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_0026f219;
      }
    }
  }
LAB_0026f21b:
  if (bVar58) {
LAB_0026f238:
    m.data = pMVar4->data;
    piVar5 = pMVar4->refcount;
    m.refcount._0_4_ = SUB84(piVar5,0);
    m.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
    m.elemsize._0_4_ = (undefined4)pMVar4->elemsize;
    m.elemsize._4_4_ = (undefined4)(pMVar4->elemsize >> 0x20);
    m.elempack = pMVar4->elempack;
    m.allocator = pMVar4->allocator;
    uVar9 = pMVar4->dims;
    uVar10 = pMVar4->w;
    uVar11 = pMVar4->h;
    uVar12 = pMVar4->d;
    m.c = pMVar4->c;
    m.cstep = pMVar4->cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    m.dims = uVar9;
    m.w = uVar10;
    m.h = uVar11;
    m.d = uVar12;
    if (iVar1 != 1) {
      m_1.data = *(void **)local_c8;
      uVar13 = local_c8->openmp_blocktime;
      uVar14 = local_c8->use_winograd_convolution;
      uVar16 = local_c8->use_sgemm_convolution;
      uVar18 = local_c8->use_int8_inference;
      uVar20 = local_c8->use_vulkan_compute;
      uVar19 = CONCAT11(uVar20,uVar18);
      uVar17 = CONCAT21(uVar19,uVar16);
      uVar15 = CONCAT31(uVar17,uVar14);
      m_1.allocator = *(Allocator **)&local_c8->use_bf16_storage;
      uVar21._0_1_ = local_c8->use_shader_pack8;
      uVar21._1_1_ = local_c8->use_subgroup_basic;
      uVar21._2_1_ = local_c8->use_subgroup_vote;
      uVar21._3_1_ = local_c8->use_subgroup_ballot;
      uVar22 = local_c8->use_subgroup_shuffle;
      uVar23 = local_c8->use_image_storage;
      uVar25 = local_c8->use_tensor_storage;
      uVar27 = local_c8->use_reserved_0;
      uVar26 = CONCAT11(uVar27,uVar25);
      uVar24 = CONCAT21(uVar26,uVar23);
      uVar21._4_4_ = CONCAT31(uVar24,uVar22);
      uVar28 = local_c8->flush_denormals;
      uVar29 = local_c8->use_local_pool_allocator;
      uVar31 = local_c8->use_shader_local_memory;
      uVar33 = local_c8->use_cooperative_matrix;
      uVar35 = local_c8->use_winograd23_convolution;
      uVar34 = CONCAT11(uVar35,uVar33);
      uVar32 = CONCAT21(uVar34,uVar31);
      uVar30 = CONCAT31(uVar32,uVar29);
      uVar36._0_1_ = local_c8->use_winograd43_convolution;
      uVar36._1_1_ = local_c8->use_winograd63_convolution;
      uVar36._2_1_ = local_c8->use_a53_a55_optimized_kernel;
      uVar36._3_1_ = local_c8->use_reserved_7;
      uVar37 = local_c8->use_reserved_8;
      uVar38 = local_c8->use_reserved_9;
      uVar40 = local_c8->use_reserved_10;
      uVar42 = local_c8->use_reserved_11;
      uVar41 = CONCAT11(uVar42,uVar40);
      uVar39 = CONCAT21(uVar41,uVar38);
      uVar36._4_4_ = CONCAT31(uVar39,uVar37);
      m_1.c = (int)uVar36;
      m_1.dims = (int)uVar21;
      m_1.elemsize._0_4_ = SUB84(local_c8->workspace_allocator,0);
      m_1.elemsize._4_4_ = (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
      m_1.refcount._0_4_ = SUB84(local_c8->workspace_allocator,0);
      m_1.refcount._4_4_ = (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
      m_1.elempack = uVar13;
      m_1._28_4_ = uVar15;
      m_1.w = uVar21._4_4_;
      m_1.h = uVar28;
      m_1.d = uVar30;
      m_1._60_4_ = uVar36._4_4_;
      convert_packing(pMVar4,&m,1,(Option *)&m_1);
    }
    m_1.data = pMVar4[1].data;
    piVar5 = pMVar4[1].refcount;
    m_1.refcount._0_4_ = SUB84(piVar5,0);
    m_1.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
    m_1.elemsize._0_4_ = (undefined4)pMVar4[1].elemsize;
    m_1.elemsize._4_4_ = (undefined4)(pMVar4[1].elemsize >> 0x20);
    m_1.elempack = pMVar4[1].elempack;
    m_1.allocator = pMVar4[1].allocator;
    uVar43 = pMVar4[1].dims;
    uVar44 = pMVar4[1].w;
    uVar45 = pMVar4[1].h;
    uVar46 = pMVar4[1].d;
    m_1.c = pMVar4[1].c;
    m_1.cstep = pMVar4[1].cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    m_1.dims = uVar43;
    m_1.w = uVar44;
    m_1.h = uVar45;
    m_1.d = uVar46;
    if (iVar2 != 1) {
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)local_c8;
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(local_c8->workspace_allocator,0);
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = SUB84(local_c8->workspace_allocator,0);
      bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
      convert_packing(pMVar4 + 1,&m_1,1,(Option *)&bottom_blobs_unpacked);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs_unpacked,2,(allocator_type *)&_woffset);
    pMVar49 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != &m) {
      piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start)->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar49->cstep = 0;
      pMVar49->data = (void *)0x0;
      pMVar49->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar49->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar49->elemsize + 4) = 0;
      pMVar49->dims = 0;
      pMVar49->w = 0;
      pMVar49->h = 0;
      pMVar49->d = 0;
      pMVar49->c = 0;
      pMVar49->data = m.data;
      pMVar49->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      pMVar49->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
      pMVar49->elempack = m.elempack;
      pMVar49->allocator = m.allocator;
      pMVar49->dims = m.dims;
      pMVar49->w = m.w;
      pMVar49->h = m.h;
      pMVar49->d = m.d;
      pMVar49->c = m.c;
      pMVar49->cstep = m.cstep;
    }
    pMVar49 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar4 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start + 1;
    if (pMVar4 != &m_1) {
      piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start[1].refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
              free(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].data);
            }
          }
          else {
            (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar49[1].cstep = 0;
      *(undefined8 *)((long)&pMVar49[1].refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar49[1].elemsize + 4) = 0;
      pMVar4->data = (void *)0x0;
      pMVar49[1].refcount = (int *)0x0;
      pMVar49[1].dims = 0;
      pMVar49[1].w = 0;
      pMVar49[1].h = 0;
      pMVar49[1].d = 0;
      pMVar49[1].c = 0;
      pMVar49[1].data = m_1.data;
      pMVar49[1].refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      pMVar49[1].elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
      pMVar49[1].elempack = m_1.elempack;
      pMVar49[1].allocator = m_1.allocator;
      pMVar49[1].dims = m_1.dims;
      pMVar49[1].w = m_1.w;
      pMVar49[1].h = m_1.h;
      pMVar49[1].d = m_1.d;
      pMVar49[1].c = m_1.c;
      pMVar49[1].cstep = m_1.cstep;
    }
    iVar55 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                           &bottom_blobs_unpacked,top_blobs,local_c8);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
    piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          if (m_1.data != (void *)0x0) {
            free(m_1.data);
          }
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m_1.cstep = 0;
    m_1.data = (void *)0x0;
    m_1.refcount._0_4_ = 0;
    m_1.refcount._4_4_ = 0;
    m_1.elemsize._0_4_ = 0;
    m_1.elemsize._4_4_ = 0;
    m_1.elempack = 0;
    m_1.dims = 0;
    m_1.w = 0;
    m_1.h = 0;
    m_1.d = 0;
    m_1.c = 0;
    piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar55;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}